

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> *
decode_utf8(string *src,llama_partial_utf8 partial_start)

{
  undefined8 in_RDX;
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_llama_partial_utf8> *in_RDI;
  uint8_t mask;
  uint8_t highbits;
  uint8_t first_byte;
  uint8_t next_byte;
  int n_remain;
  uint32_t value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> code_points;
  char *pos;
  value_type_conflict2 *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  byte *local_20;
  int iStack_c;
  
  iStack_c = (int)((ulong)in_RDX >> 0x20);
  local_20 = (byte *)std::__cxx11::string::c_str();
  pvVar1 = &local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3f4d73);
  std::__cxx11::string::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(size_type)pvVar1);
  local_4c = iStack_c;
  for (; uVar2 = *local_20 != 0 && 0 < local_4c, *local_20 != 0 && 0 < local_4c;
      local_20 = local_20 + 1) {
    if ((int)(uint)*local_20 >> 6 != 2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      std::make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,llama_partial_utf8>
                (in_stack_ffffffffffffff58,
                 (llama_partial_utf8 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                );
      goto LAB_003f5086;
    }
    local_4c = local_4c + -1;
  }
  if ((0 < iStack_c) && (local_4c == 0)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff60),
               (value_type_conflict2 *)in_stack_ffffffffffffff58);
  }
  do {
    if (*local_20 == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      std::make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,llama_partial_utf8>
                (in_stack_ffffffffffffff58,
                 (llama_partial_utf8 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                );
LAB_003f5086:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff60));
      return in_RDI;
    }
    local_4c = decode_utf8::lookup[(byte)((int)(uint)*local_20 >> 4)] + -1;
    if (local_4c < 0) {
      pvVar1 = &local_38;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3f4f25);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      std::make_pair<std::vector<unsigned_int,std::allocator<unsigned_int>>,llama_partial_utf8>
                (pvVar1,(llama_partial_utf8 *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      goto LAB_003f5086;
    }
    while( true ) {
      local_20 = local_20 + 1;
      in_stack_ffffffffffffff57 = *local_20 != 0 && 0 < local_4c;
      if (*local_20 == 0 || 0 >= local_4c) break;
      local_4c = local_4c + -1;
    }
    if (local_4c == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff60),
                 (value_type_conflict2 *)in_stack_ffffffffffffff58);
    }
  } while( true );
}

Assistant:

static std::pair<std::vector<uint32_t>, llama_partial_utf8> decode_utf8(
        const std::string & src,
        llama_partial_utf8 partial_start) {
    static const int      lookup[] = { 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 2, 2, 3, 4 };
    const char          * pos      = src.c_str();
    std::vector<uint32_t> code_points;

    // common english strings have the same number of codepoints and bytes. `+ 1` for the terminating 0.
    code_points.reserve(src.size() + 1);
    uint32_t value    = partial_start.value;
    int      n_remain = partial_start.n_remain;

    // continue previous decode, if applicable
    while (*pos != 0 && n_remain > 0) {
        uint8_t next_byte = static_cast<uint8_t>(*pos);
        if ((next_byte >> 6) != 2) {
            // invalid sequence, abort
            code_points.push_back(0);
            return std::make_pair(std::move(code_points), llama_partial_utf8{ 0, -1 });
        }
        value = (value << 6) + (next_byte & 0x3F);
        ++pos;
        --n_remain;
    }

    if (partial_start.n_remain > 0 && n_remain == 0) {
        code_points.push_back(value);
    }

    // decode any subsequent utf-8 sequences, which may end in an incomplete one
    while (*pos != 0) {
        uint8_t first_byte = static_cast<uint8_t>(*pos);
        uint8_t highbits   = first_byte >> 4;
        n_remain   = lookup[highbits] - 1;

        if (n_remain < 0) {
            // invalid sequence, abort
            code_points.clear();
            code_points.push_back(0);
            return std::make_pair(std::move(code_points), llama_partial_utf8{ 0, n_remain });
        }

        uint8_t mask  = (1 << (7 - n_remain)) - 1;
        value = first_byte & mask;

        ++pos;
        while (*pos != 0 && n_remain > 0) {
            value = (value << 6) + (static_cast<uint8_t>(*pos) & 0x3F);
            ++pos;
            --n_remain;
        }
        if (n_remain == 0) {
            code_points.push_back(value);
        }
    }
    code_points.push_back(0);

    return std::make_pair(std::move(code_points), llama_partial_utf8{ value, n_remain });
}